

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessing.c
# Opt level: O1

Queue * lex_line(Source_File *src,Translation_Data *translation_data,char lex_defined_token)

{
  char cVar1;
  char cVar2;
  KEYWORDS KVar3;
  Queue *q;
  token *__ptr;
  token *ptVar4;
  void *pvVar5;
  char *pcVar6;
  long lVar7;
  Source_File *pSVar8;
  Source_File *pSVar9;
  byte bVar10;
  Source_File temp_src;
  Source_File local_98;
  
  bVar10 = 0;
  q = (Queue *)malloc(0x18);
  Queue_Init(q);
  pSVar8 = src;
  pSVar9 = &local_98;
  for (lVar7 = 0xd; lVar7 != 0; lVar7 = lVar7 + -1) {
    pSVar9->src_name = pSVar8->src_name;
    pSVar8 = (Source_File *)((long)pSVar8 + (ulong)bVar10 * -0x10 + 8);
    pSVar9 = (Source_File *)((long)pSVar9 + (ulong)bVar10 * -0x10 + 8);
  }
  goto_new_line(src,translation_data);
  cVar1 = src->src[src->where_in_src];
  src->src[src->where_in_src] = '\0';
  translation_data->tokens = q;
  __ptr = get_next_token(&local_98,chonky,'\0');
  KVar3 = __ptr->type;
  if (KVar3 != KW_NOTYPE) {
    do {
      if ((KVar3 == KW_ID && lex_defined_token != '\0') && (__ptr->data_size == 7)) {
        cVar2 = gstrn_cmp(__ptr->data,"defined",7);
        if (cVar2 != '\0') {
          free(__ptr);
          __ptr = get_next_token(&local_98,chonky,'\0');
          if (__ptr->type == KW_ID) {
LAB_001474d7:
            pvVar5 = Map_Check(translation_data->macros,__ptr->data,__ptr->data_size);
            __ptr->type = KW_DECIMAL_CONSTANT;
            if (pvVar5 == (void *)0x0) {
              pcVar6 = "0";
            }
            else {
              pcVar6 = "1";
            }
            __ptr->data = pcVar6;
            __ptr->data_size = 1;
          }
          else {
            if (__ptr->type == KW_OPEN_NORMAL) {
              free(__ptr);
              __ptr = get_next_token(&local_98,chonky,'\0');
              if (__ptr->type == KW_ID) {
                ptVar4 = get_next_token(&local_98,chonky,'\0');
                if (ptVar4->type == KW_CLOSE_NORMAL) goto LAB_001474d7;
                pcVar6 = "expected an \')\' after id in define";
              }
              else {
                pcVar6 = "expected an id after \'(\' in defined";
              }
            }
            else {
              pcVar6 = "expected an id after define";
            }
            push_lexing_error(pcVar6,src,translation_data);
          }
        }
      }
      Queue_Push(q,__ptr);
      __ptr = get_next_token(&local_98,chonky,'\0');
      KVar3 = __ptr->type;
    } while (KVar3 != KW_NOTYPE);
  }
  free(__ptr);
  src->src[src->where_in_src] = cVar1;
  return q;
}

Assistant:

struct Queue* lex_line(struct Source_File *src,struct Translation_Data *translation_data,char lex_defined_token)
{

	struct Source_File temp_src;
	struct token *hold_token;
	struct Queue *tokens;
	char just_in_case;

	tokens=malloc(sizeof(struct Queue));
	Queue_Init(tokens);


	temp_src=*src;
	goto_new_line(src,translation_data);
	just_in_case=src->src[src->where_in_src];
	src->src[src->where_in_src]='\0';

	translation_data->tokens=tokens;
	
	while((hold_token=get_next_token(&temp_src,&chonky[0],0))->type!=KW_NOTYPE)
	{
		if(lex_defined_token && hold_token->type==KW_ID && hold_token->data_size==7 && gstrn_cmp(hold_token->data,"defined",7))
		{
			free(hold_token);
			hold_token=get_next_token(&temp_src,&chonky[0],0);
			if(hold_token->type==KW_OPEN_NORMAL)
			{
				free(hold_token);
				hold_token=get_next_token(&temp_src,&chonky[0],0);
				if(hold_token->type!=KW_ID)
				{
					push_lexing_error("expected an id after '(' in defined",src,translation_data);
				}else
				{
					struct token *hold_closing_token;
					hold_closing_token=get_next_token(&temp_src,&chonky[0],0);
					if(hold_closing_token->type!=KW_CLOSE_NORMAL)
					{
						push_lexing_error("expected an ')' after id in define",src,translation_data);
					}else
					{
						if(!Map_Check(translation_data->macros,hold_token->data,hold_token->data_size))
						{
							hold_token->type=KW_DECIMAL_CONSTANT;
							hold_token->data="0";
							hold_token->data_size=1;
						}else
						{
							hold_token->type=KW_DECIMAL_CONSTANT;
							hold_token->data="1";
							hold_token->data_size=1;
						}

					}
				}
			}else if(hold_token->type!=KW_ID)
			{
				push_lexing_error("expected an id after define",src,translation_data);
			}else
			{
				if(!Map_Check(translation_data->macros,hold_token->data,hold_token->data_size))
				{
					hold_token->type=KW_DECIMAL_CONSTANT;
					hold_token->data="0";
					hold_token->data_size=1;
				}else
				{
					hold_token->type=KW_DECIMAL_CONSTANT;
					hold_token->data="1";
					hold_token->data_size=1;
				}
			}
		}
		Queue_Push(tokens,hold_token);
	}

	free(hold_token);
	src->src[src->where_in_src]=just_in_case;

	return tokens;
}